

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,Res res)

{
  bool bVar1;
  int iVar2;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *pPVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PtexFaceData *pPVar8;
  undefined4 extraout_var_04;
  Res in_DX;
  uint in_ESI;
  PtexReader *in_RDI;
  size_t tableNewMemUsed;
  FaceData *src_2;
  PtexPtr<Ptex::v2_2::PtexFaceData> psrc_2;
  FaceData *src_1;
  PtexPtr<Ptex::v2_2::PtexFaceData> psrc_1;
  bool blendu;
  FaceData *src;
  PtexPtr<Ptex::v2_2::PtexFaceData> psrc;
  size_t newMemUsed;
  FaceData *newface;
  FaceData *face;
  ReductionKey key;
  FaceData *face_2;
  int rfaceid;
  Level *level_1;
  int levelid;
  FaceData *face_1;
  Level *level;
  int redv;
  int redu;
  FaceInfo *fi;
  PtexPtr<Ptex::v2_2::PtexFaceData> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  PtexReader *in_stack_fffffffffffffe70;
  PtexPtr<Ptex::v2_2::PtexFaceData> *this_00;
  Level *in_stack_fffffffffffffe78;
  undefined1 deleteOnRelease;
  PtexReader *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
  *in_stack_fffffffffffffe90;
  ReductionKey *in_stack_fffffffffffffe98;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
  *in_stack_fffffffffffffea0;
  bool local_119;
  Res local_f2;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_f0;
  Res local_e2;
  ReductionKey *local_e0;
  Res local_d2;
  undefined1 local_d0 [14];
  Res local_c2;
  PtexFaceData *local_c0;
  Res local_b2;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_b0;
  size_t local_a8;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *local_a0;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *local_98;
  Res local_8a;
  Res local_7a;
  FaceData *local_78;
  value_type local_6c;
  Level *local_68;
  int local_60;
  Res local_5a;
  Level *local_50;
  int local_44;
  int local_40;
  Res local_2a;
  reference local_28;
  uint local_1c;
  Res local_a;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *local_8;
  
  if ((((in_RDI->_ok & 1U) == 0) || ((int)in_ESI < 0)) ||
     ((ulong)(in_RDI->_header).nfaces <= (ulong)(long)(int)in_ESI)) {
    local_8 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
               *)errorData(in_stack_fffffffffffffe80,
                           SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0));
  }
  else {
    local_1c = in_ESI;
    local_a = in_DX;
    local_28 = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::operator[]
                         (&in_RDI->_faceinfo,(long)(int)in_ESI);
    bVar1 = FaceInfo::isConstant(local_28);
    local_119 = true;
    if (!bVar1) {
      Res::Res(&local_2a,0);
      local_119 = Res::operator==(&local_a,&local_2a);
    }
    if (local_119 == false) {
      local_40 = (int)(local_28->res).ulog2 - (int)local_a.ulog2;
      local_44 = (int)(local_28->res).vlog2 - (int)local_a.vlog2;
      if ((local_40 == 0) && (local_44 == 0)) {
        local_50 = getLevel(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_5a = local_a;
        local_8 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                   *)getFace((PtexReader *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                             (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                             in_stack_fffffffffffffe78,
                             (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                             SUB82((ulong)in_stack_fffffffffffffe90 >> 0x30,0));
      }
      else {
        if ((local_40 == local_44) && (bVar1 = FaceInfo::hasEdits(local_28), !bVar1)) {
          local_60 = local_40;
          uVar4 = (ulong)local_40;
          sVar5 = std::
                  vector<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                  ::size(&in_RDI->_levels);
          if (uVar4 < sVar5) {
            local_68 = getLevel(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&in_RDI->_rfaceids,(long)(int)local_1c);
            local_6c = *pvVar6;
            local_78 = (FaceData *)0x0;
            uVar4 = (ulong)(int)local_6c;
            sVar5 = std::
                    vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                    ::size(&local_68->faces);
            if (uVar4 < sVar5) {
              local_7a = local_a;
              local_78 = getFace((PtexReader *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                                 in_stack_fffffffffffffe78,
                                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                 SUB82((ulong)in_stack_fffffffffffffe90 >> 0x30,0));
            }
            if (local_78 != (FaceData *)0x0) {
              return &local_78->super_PtexFaceData;
            }
          }
        }
        deleteOnRelease = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
        local_8a = local_a;
        ReductionKey::ReductionKey
                  ((ReductionKey *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                   SUB82((ulong)in_stack_fffffffffffffe70 >> 0x30,0));
        local_98 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                    *)PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                      ::get(in_stack_fffffffffffffe90,
                            (ReductionKey *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_8 = local_98;
        if (local_98 ==
            (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *
            )0x0) {
          local_a0 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                      *)0x0;
          local_a8 = 0;
          if ((local_a.ulog2 < '\0') || ((short)local_a < 0)) {
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "PtexReader::getData - reductions below 1 pixel not supported")
            ;
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            local_a0 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                        *)errorData(in_stack_fffffffffffffe80,(bool)deleteOnRelease);
          }
          else if ((local_40 < 0) || (local_44 < 0)) {
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "PtexReader::getData - enlargements not supported");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            local_a0 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                        *)errorData(in_stack_fffffffffffffe80,(bool)deleteOnRelease);
          }
          else if ((in_RDI->_header).meshtype == 0) {
            if (local_40 == local_44) {
              Res::Res(&local_b2,local_a.ulog2 + '\x01',local_a.vlog2 + '\x01');
              iVar2 = (*(in_RDI->super_PtexTexture)._vptr_PtexTexture[0x14])
                                (in_RDI,(ulong)local_1c,(ulong)(ushort)local_b2);
              PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr
                        (&local_b0,(PtexFaceData *)CONCAT44(extraout_var,iVar2));
              local_c0 = PtexPtr<Ptex::v2_2::PtexFaceData>::get(&local_b0);
              local_c2 = local_a;
              iVar2 = (*local_c0->_vptr_PtexFaceData[10])
                                (local_c0,in_RDI,(ulong)(ushort)local_a,PtexUtils::reduceTri,
                                 &local_a8);
              in_stack_fffffffffffffea0 =
                   (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                    *)CONCAT44(extraout_var_00,iVar2);
              local_a0 = in_stack_fffffffffffffea0;
              PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(in_stack_fffffffffffffe60);
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "PtexReader::getData - anisotropic reductions not supported for triangle mesh"
                                      );
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              local_a0 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                          *)errorData(in_stack_fffffffffffffe80,(bool)deleteOnRelease);
            }
          }
          else {
            if (local_40 == local_44) {
              local_d0[0xd] = ((ushort)local_a & 1) != 0;
            }
            else {
              local_d0[0xd] = local_44 < local_40;
            }
            if ((bool)local_d0[0xd] == false) {
              Res::Res(&local_f2,local_a.ulog2,local_a.vlog2 + '\x01');
              iVar2 = (*(in_RDI->super_PtexTexture)._vptr_PtexTexture[0x14])
                                (in_RDI,(ulong)local_1c,(ulong)(ushort)local_f2);
              this_00 = &local_f0;
              PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr
                        (this_00,(PtexFaceData *)CONCAT44(extraout_var_03,iVar2));
              pPVar8 = PtexPtr<Ptex::v2_2::PtexFaceData>::get(this_00);
              iVar2 = (*pPVar8->_vptr_PtexFaceData[10])
                                (pPVar8,in_RDI,(ulong)(ushort)local_a,PtexUtils::reducev,&local_a8);
              local_a0 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                          *)CONCAT44(extraout_var_04,iVar2);
              PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr
                        ((PtexPtr<Ptex::v2_2::PtexFaceData> *)local_a0);
            }
            else {
              Res::Res(&local_d2,local_a.ulog2 + '\x01',local_a.vlog2);
              iVar2 = (*(in_RDI->super_PtexTexture)._vptr_PtexTexture[0x14])
                                (in_RDI,(ulong)local_1c,(ulong)(ushort)local_d2);
              in_stack_fffffffffffffe90 =
                   (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                    *)local_d0;
              PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr
                        ((PtexPtr<Ptex::v2_2::PtexFaceData> *)in_stack_fffffffffffffe90,
                         (PtexFaceData *)CONCAT44(extraout_var_01,iVar2));
              in_stack_fffffffffffffe98 =
                   (ReductionKey *)
                   PtexPtr<Ptex::v2_2::PtexFaceData>::get
                             ((PtexPtr<Ptex::v2_2::PtexFaceData> *)in_stack_fffffffffffffe90);
              local_e2 = local_a;
              local_e0 = in_stack_fffffffffffffe98;
              iVar2 = (*((_func_int **)in_stack_fffffffffffffe98->_val)[10])
                                (in_stack_fffffffffffffe98,in_RDI,(ulong)(ushort)local_a,
                                 PtexUtils::reduceu,&local_a8);
              local_a0 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                          *)CONCAT44(extraout_var_02,iVar2);
              PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(in_stack_fffffffffffffe60);
              in_stack_fffffffffffffe8c = local_1c;
            }
          }
          local_98 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                      *)PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                        ::tryInsert(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                    (FaceData *)in_stack_fffffffffffffe90,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          if (local_98 == local_a0) {
            increaseMemUsed(in_RDI,local_a8);
          }
          else if (local_a0 !=
                   (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                    *)0x0) {
            (*((PtexFaceData *)&local_a0->_entries)->_vptr_PtexFaceData[1])();
          }
          local_8 = local_98;
        }
      }
    }
    else {
      pPVar3 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
                *)operator_new(0x18);
      iVar2 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      getConstData(in_RDI);
      ConstDataPtr::ConstDataPtr
                ((ConstDataPtr *)in_stack_fffffffffffffe70,
                 (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),iVar2);
      local_8 = pPVar3;
    }
  }
  return (PtexFaceData *)local_8;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // determine how many reduction levels are needed
    int redu = fi.res.ulog2 - res.ulog2, redv = fi.res.vlog2 - res.vlog2;

    if (redu == 0 && redv == 0) {
        // no reduction - get level zero (full) res face
        Level* level = getLevel(0);
        FaceData* face = getFace(0, level, faceid, res);
        return face;
    }

    if (redu == redv && !fi.hasEdits()) {
        // reduction is symmetric and non-negative
        // and face has no edits => access data from reduction level (if present)
        int levelid = redu;
        if (size_t(levelid) < _levels.size()) {
            Level* level = getLevel(levelid);

            // get reduction face id
            int rfaceid = _rfaceids[faceid];

            // get the face data (if present)
            FaceData* face = 0;
            if (size_t(rfaceid) < level->faces.size()) {
                face = getFace(levelid, level, rfaceid, res);
            }
            if (face) {
                return face;
            }
        }
    }

    // dynamic reduction required - look in dynamic reduction cache
    ReductionKey key(faceid, res);
    FaceData* face = _reductions.get(key);
    if (face) {
        return face;
    }

    // not found,  generate new reduction
    FaceData *newface = 0;
    size_t newMemUsed = 0;

    if (res.ulog2 < 0 || res.vlog2 < 0) {
        std::cerr << "PtexReader::getData - reductions below 1 pixel not supported" << std::endl;
        newface = errorData();
    }
    else if (redu < 0 || redv < 0) {
        std::cerr << "PtexReader::getData - enlargements not supported" << std::endl;
        newface = errorData();
    }
    else if (_header.meshtype == mt_triangle)
    {
        if (redu != redv) {
            std::cerr << "PtexReader::getData - anisotropic reductions not supported for triangle mesh" << std::endl;
            newface = errorData();
        }
        else {
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceTri, newMemUsed);
        }
    }
    else {
        // determine which direction to blend
        bool blendu;
        if (redu == redv) {
            // for symmetric face blends, alternate u and v blending
            blendu = (res.ulog2 & 1);
        }
        else blendu = redu > redv;

        if (blendu) {
            // get next-higher u-res and reduce in u
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)res.vlog2)) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceu, newMemUsed);
        }
        else {
            // get next-higher v-res and reduce in v
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)res.ulog2, (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reducev, newMemUsed);
        }
    }

    size_t tableNewMemUsed = 0;
    face = _reductions.tryInsert(key, newface, tableNewMemUsed);
    if (face != newface) {
        delete newface;
    }
    else {
        increaseMemUsed(newMemUsed + tableNewMemUsed);
    }
    return face;
}